

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_input_glyph(nk_context *ctx,char *glyph)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  nk_rune unicode;
  nk_rune local_14;
  
  local_14 = (nk_rune)((ulong)in_RAX >> 0x20);
  if (ctx != (nk_context *)0x0) {
    iVar3 = nk_utf_decode(glyph,&local_14,4);
    if (iVar3 != 0) {
      iVar2 = (ctx->input).keyboard.text_len;
      if (iVar2 + iVar3 < 0x10) {
        nk_utf_encode(local_14,(ctx->input).keyboard.text + iVar2,0x10 - iVar2);
        piVar1 = &(ctx->input).keyboard.text_len;
        *piVar1 = *piVar1 + iVar3;
      }
    }
    return;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x3675,"void nk_input_glyph(struct nk_context *, const char *)");
}

Assistant:

NK_API void
nk_input_glyph(struct nk_context *ctx, const nk_glyph glyph)
{
    int len = 0;
    nk_rune unicode;
    struct nk_input *in;

    NK_ASSERT(ctx);
    if (!ctx) return;
    in = &ctx->input;

    len = nk_utf_decode(glyph, &unicode, NK_UTF_SIZE);
    if (len && ((in->keyboard.text_len + len) < NK_INPUT_MAX)) {
        nk_utf_encode(unicode, &in->keyboard.text[in->keyboard.text_len],
            NK_INPUT_MAX - in->keyboard.text_len);
        in->keyboard.text_len += len;
    }
}